

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# module-loader.c++
# Opt level: O3

void __thiscall
capnp::compiler::ModuleLoader::Impl::addImportPath(Impl *this,ReadableDirectory *dir)

{
  RemoveConst<const_kj::ReadableDirectory_*> **pppRVar1;
  RemoveConst<const_kj::ReadableDirectory_*> *ppRVar2;
  RemoveConst<const_kj::ReadableDirectory_*> *ppRVar3;
  size_t newSize;
  
  ppRVar3 = (this->searchPath).builder.pos;
  if (ppRVar3 == (this->searchPath).builder.endPtr) {
    ppRVar2 = (this->searchPath).builder.ptr;
    newSize = 4;
    if (ppRVar3 != ppRVar2) {
      newSize = (long)ppRVar3 - (long)ppRVar2 >> 2;
    }
    kj::Vector<const_kj::ReadableDirectory_*>::setCapacity(&this->searchPath,newSize);
    ppRVar3 = (this->searchPath).builder.pos;
  }
  *ppRVar3 = dir;
  pppRVar1 = &(this->searchPath).builder.pos;
  *pppRVar1 = *pppRVar1 + 1;
  return;
}

Assistant:

void addImportPath(const kj::ReadableDirectory& dir) {
    searchPath.add(&dir);
  }